

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uraid.c
# Opt level: O1

LispPTR parse_atomstring(char *string)

{
  int iVar1;
  uint uVar2;
  ushort packlen;
  char *in_RCX;
  DLword length;
  char *pcVar3;
  LispPTR LVar4;
  ushort uVar5;
  ushort uVar6;
  char *unaff_R14;
  
  pcVar3 = string + 1;
  packlen = 0;
  uVar5 = 0;
  do {
    if (pcVar3[-1] == ':') {
      pcVar3[-1] = '\0';
      uVar6 = 0;
      in_RCX = pcVar3;
      unaff_R14 = string;
      packlen = uVar5;
    }
    else {
      uVar6 = uVar5;
      if (pcVar3[-1] == '\0') break;
    }
    uVar5 = uVar6 + 1;
    pcVar3 = pcVar3 + 1;
  } while( true );
  length = uVar5 - (packlen != 0);
  if ((packlen == 0) ||
     (iVar1 = strncmp(unaff_R14,"IL",(ulong)packlen), string = in_RCX, iVar1 == 0)) {
    uVar2 = make_atom(string,0,length);
    if (uVar2 != 0xffffffff) goto LAB_0013936a;
    puts("trying IL:");
    unaff_R14 = "INTERLISP";
    packlen = 9;
    in_RCX = string;
  }
  uVar2 = get_package_atom(in_RCX,length,unaff_R14,packlen,0);
LAB_0013936a:
  if (uVar2 == 0xffffffff) {
    LVar4 = 0xffffffff;
  }
  else {
    LVar4 = uVar2 & 0xffff;
    printf("INDEX : %d\n",(ulong)LVar4);
  }
  return LVar4;
}

Assistant:

LispPTR parse_atomstring(char *string)
{
  char *start, *packageptr, *nameptr;
  DLword packagelen = 0;
  DLword namelen = 0;
  DLword cnt;
  LispPTR aindex;

  for (cnt = 0, start = string; *string != '\0'; string++, cnt++) {
    if (*string == ':') {
      packagelen = cnt;
      packageptr = start;
      nameptr = string + 1;
      cnt = 0;
      *string = 0;
    }
  }
  if (packagelen == 0) { /* treat as IL: */
    nameptr = start;
    namelen = cnt;
  } else
    namelen = cnt - 1;

  if ((packagelen == 0) || (strncmp(packageptr, "IL", packagelen) == 0)) { /* default IL: */
    aindex = make_atom(nameptr, 0, namelen);
    if (aindex == 0xffffffff) {
      printf("trying IL:\n");
      aindex = get_package_atom(nameptr, namelen, "INTERLISP", 9, 0);
    }
  } else
    aindex = get_package_atom(nameptr, namelen, packageptr, packagelen, 0);

  if (aindex == 0xffffffff) return (0xffffffff);
  printf("INDEX : %d\n", aindex & 0xffff);
  return (aindex & 0xffff);
}